

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O3

void __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
::rehash(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
         *this,size_t new_size)

{
  size_type sVar1;
  container *pcVar2;
  container *pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  ulong uVar7;
  undefined8 *puVar8;
  size_type sVar9;
  intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::container>
  *piVar10;
  uint uVar11;
  container *pcVar12;
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
  local_68;
  value_type local_38;
  
  local_68.list_.end = (container *)0x0;
  local_68.size_ = 0;
  local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  local_68.list_.begin = (container *)0x0;
  local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38.first = (container *)0x0;
  local_38.second = (container *)0x0;
  std::vector<$22329872$>::resize(&local_68.hash_,new_size,&local_38);
  pcVar12 = (this->list_).begin;
  if (pcVar12 != (container *)0x0) {
    do {
      intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::container>
      ::erase(&this->list_,pcVar12);
      sVar1 = (pcVar12->val).first._M_string_length;
      if (sVar1 == 0) {
        uVar7 = 0;
      }
      else {
        sVar9 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 * 0x10 + (uint)(byte)(pcVar12->val).first._M_dataplus._M_p[sVar9];
          uVar11 = uVar11 & 0xfffffff ^ uVar11 >> 0x18 & 0xfffffff0;
          sVar9 = sVar9 + 1;
        } while (sVar1 != sVar9);
        uVar7 = (ulong)uVar11;
      }
      uVar7 = (ulong)(uint)((int)(uVar7 % (ulong)((long)local_68.hash_.
                                                        super__Vector_base<_22329872_>._M_impl.
                                                        super__Vector_impl_data._M_finish -
                                                  (long)local_68.hash_.
                                                        super__Vector_base<_22329872_>._M_impl.
                                                        super__Vector_impl_data._M_start >> 4)) << 4
                           );
      puVar8 = (undefined8 *)
               ((long)&(local_68.hash_.super__Vector_base<_22329872_>._M_impl.
                        super__Vector_impl_data._M_start)->first + uVar7);
      if (*(long *)((long)&(local_68.hash_.super__Vector_base<_22329872_>._M_impl.
                            super__Vector_impl_data._M_start)->first + uVar7) == 0) {
        pcVar12->next = (container *)0x0;
        pcVar12->prev = local_68.list_.end;
        if (local_68.list_.end != (container *)0x0) {
          (local_68.list_.end)->next = pcVar12;
        }
        if (local_68.list_.begin == (container *)0x0) {
          local_68.list_.begin = pcVar12;
        }
        piVar10 = (intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::container>
                   *)(puVar8 + 1);
        local_68.list_.end = pcVar12;
LAB_002051c3:
        piVar10->begin = pcVar12;
      }
      else {
        pcVar2 = (container *)puVar8[1];
        puVar8 = puVar8 + 1;
        pcVar3 = pcVar2->next;
        if (pcVar3 != (container *)0x0) {
          pcVar12->prev = pcVar2;
          pcVar12->next = pcVar3;
          piVar10 = (intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::container>
                     *)&pcVar2->next;
          if (pcVar2->next != (container *)0x0) {
            pcVar2->next->prev = pcVar12;
          }
          goto LAB_002051c3;
        }
        pcVar12->next = (container *)0x0;
        pcVar12->prev = local_68.list_.end;
        if (local_68.list_.end != (container *)0x0) {
          (local_68.list_.end)->next = pcVar12;
        }
        piVar10 = &local_68.list_;
        local_68.list_.end = pcVar12;
        if (local_68.list_.begin == (container *)0x0) goto LAB_002051c3;
      }
      *puVar8 = pcVar12;
      pcVar12 = (this->list_).begin;
    } while (pcVar12 != (container *)0x0);
  }
  pcVar2 = local_68.list_.begin;
  pcVar12 = (this->list_).end;
  (this->list_).end = local_68.list_.end;
  ppVar4 = (this->hash_).super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->hash_).super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = (this->hash_).super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->hash_).super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_start =
       local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_start;
  (this->hash_).super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_finish =
       local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_finish;
  local_68.list_.begin = (container *)0x0;
  (this->hash_).super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (this->list_).begin = pcVar2;
  local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  if (ppVar5 != ppVar4) {
    local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_finish = ppVar4
    ;
  }
  local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_start = ppVar4;
  local_68.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       ppVar6;
  local_68.list_.end = pcVar12;
  ~basic_map(&local_68);
  return;
}

Assistant:

void rehash(size_t new_size)
	{
		basic_map tmp;
		tmp.hash_.resize(new_size,range_type(iterator(),iterator()));
		while(list_.begin) {
			iterator p=list_.begin;
			list_.erase(p);
			range_type &r = tmp.get(p->val.first);
			if(r.first == 0) {
				tmp.list_.push_back(p);
				r.first = r.second = p;
			}
			else {
				tmp.list_.insert_after(p,r.second);
				r.second = p;
			}
		}
		list_.swap(tmp.list_);
		hash_.swap(tmp.hash_);
		tmp.hash_.clear();
	}